

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_sparse.c
# Opt level: O0

void test_2(void)

{
  undefined1 auVar1 [16];
  undefined8 v1;
  int64_t iVar2;
  int iVar3;
  mode_t mVar4;
  wchar_t wVar5;
  void *__s;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  la_ssize_t lVar9;
  la_int64_t v2;
  ulong local_450;
  unsigned_long i;
  char buff3 [1024];
  size_t buff2_size;
  char *buff2;
  int64_t length;
  int64_t offset;
  size_t blocksize;
  size_t used;
  archive *a;
  archive_entry *ae;
  
  offset = 0x2800;
  buff3[0x3f8] = '\0';
  buff3[0x3f9] = '\x10';
  buff3[0x3fa] = '\x01';
  buff3[0x3fb] = '\0';
  buff3[0x3fc] = '\0';
  buff3[0x3fd] = '\0';
  buff3[0x3fe] = '\0';
  buff3[0x3ff] = '\0';
  __s = malloc(0x11000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'º',(uint)(__s != (void *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'¼',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar3 = archive_write_set_format_pax((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_pax(a)",
                      (void *)used);
  iVar3 = archive_write_add_filter_none((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'À',0,"ARCHIVE_OK",(long)iVar3,"archive_write_add_filter_none(a)",
                      (void *)used);
  iVar3 = archive_write_set_bytes_per_block((archive *)used,(int)offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Â',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_bytes_per_block(a, (int)blocksize)",(void *)used);
  iVar3 = archive_write_set_bytes_in_last_block((archive *)used,(int)offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_bytes_in_last_block(a, (int)blocksize)",(void *)used);
  iVar2 = offset;
  iVar3 = archive_write_get_bytes_in_last_block((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Æ',iVar2,"blocksize",(long)iVar3,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  iVar3 = archive_write_open_memory((archive *)used,buff,1000000,&blocksize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)used);
  iVar2 = offset;
  iVar3 = archive_write_get_bytes_in_last_block((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ê',iVar2,"blocksize",(long)iVar3,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'Ï',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)a,1,10);
  tVar6 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ñ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ò',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  pcVar8 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'Ô',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  mVar4 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ö',0x81ed,"S_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size((archive_entry *)a,0x81000);
  archive_entry_sparse_add_entry((archive_entry *)a,0x10000,0x1000);
  archive_entry_sparse_add_entry((archive_entry *)a,0x80000,0x1000);
  iVar3 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",(void *)used);
  archive_entry_free((archive_entry *)a);
  memset(__s,0x61,buff3._1016_8_);
  v1 = buff3._1016_8_;
  lVar9 = archive_write_data((archive *)used,__s,buff3._1016_8_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ß',v1,"buff2_size",lVar9,"archive_write_data(a, buff2, buff2_size)",
                      (void *)0x0);
  iVar3 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)used);
  iVar3 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  failure("blocksize=%zu",offset);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = offset;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'è',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2bff)) / auVar1,0) + 1) *
                             offset,"((11264 - 1)/blocksize+1)*blocksize",blocksize,"used",
                      (void *)0x0);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'í',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar3 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'î',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar3 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar3 = archive_read_open_memory((archive *)used,buff,blocksize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  iVar3 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",
                      (void *)used);
  tVar6 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ô',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'õ',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ö',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'÷',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'ø',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ù',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar4 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ú',0x81ed,"AE_IFREG | 0755",(ulong)mVar4,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'û',0x81000,"0x81000",v2,"archive_entry_size(ae)",(void *)0x0);
  wVar5 = archive_entry_sparse_reset((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ý',2,"2",(long)wVar5,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar5 = archive_entry_sparse_next((archive_entry *)a,&length,(la_int64_t *)&buff2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'þ',0,"0",(long)wVar5,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ÿ',0x10000,"0x10000",length,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ā',0x1000,"0x1000",(longlong)buff2,"length",(void *)0x0);
  wVar5 = archive_entry_sparse_next((archive_entry *)a,&length,(la_int64_t *)&buff2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ā',0,"0",(long)wVar5,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ă',0x80000,"0x80000",length,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ă',0x1000,"0x1000",(longlong)buff2,"length",(void *)0x0);
  memset(&i,0,0x400);
  for (local_450 = 0; local_450 < 0x10000; local_450 = local_450 + 0x400) {
    lVar9 = archive_read_data((archive *)used,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ć',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",local_450,local_450 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ċ',__s,"buff2",&i,"buff3",0x400,"1024",(void *)0x0);
  }
  memset(&i,0x61,0x400);
  for (local_450 = 0x10000; local_450 < 0x11000; local_450 = local_450 + 0x400) {
    lVar9 = archive_read_data((archive *)used,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ď',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",local_450,local_450 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'đ',__s,"buff2",&i,"buff3",0x400,"1024",(void *)0x0);
  }
  memset(&i,0,0x400);
  for (local_450 = 0x11000; local_450 < 0x80000; local_450 = local_450 + 0x400) {
    lVar9 = archive_read_data((archive *)used,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ĕ',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",local_450,local_450 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ę',__s,"buff2",&i,"buff3",0x400,"1024",(void *)0x0);
  }
  memset(&i,0,0x400);
  for (local_450 = 0x80000; local_450 < 0x81000; local_450 = local_450 + 0x400) {
    lVar9 = archive_read_data((archive *)used,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ĝ',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",local_450,local_450 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ğ',__s,"buff2",&i,"buff3",0x400,"1024",(void *)0x0);
  }
  iVar3 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ĥ',1,"ARCHIVE_EOF",(long)iVar3,"archive_read_next_header(a, &ae)",
                      (void *)used);
  iVar3 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ĥ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",(void *)used);
  iVar3 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ħ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  free(__s);
  return;
}

Assistant:

static void
test_2(void)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t blocksize = 20 * 512;
	int64_t offset, length;
	char *buff2;
	size_t buff2_size = 0x11000;
	char buff3[1024];
	unsigned long i;

	assert((buff2 = malloc(buff2_size)) != NULL);
	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_pax(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, (int)blocksize));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_in_last_block(a, (int)blocksize));
	assertEqualInt(blocksize,
	    archive_write_get_bytes_in_last_block(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));
	assertEqualInt(blocksize,
	    archive_write_get_bytes_in_last_block(a));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
	archive_entry_set_size(ae, 0x81000);
	archive_entry_sparse_add_entry(ae, 0x10000, 0x1000);
	archive_entry_sparse_add_entry(ae, 0x80000, 0x1000);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	memset(buff2, 'a', buff2_size);
	/* Write bytes less than it should be. */
	assertEqualInt(buff2_size, archive_write_data(a, buff2, buff2_size));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* This calculation gives "the smallest multiple of
	 * the block size that is at least 11264 bytes". */
	failure("blocksize=%zu", blocksize);
	assertEqualInt(((11264 - 1)/blocksize+1)*blocksize, used);

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(0x81000, archive_entry_size(ae));
	/* Verify sparse information. */
	assertEqualInt(2, archive_entry_sparse_reset(ae));
	assertEqualInt(0, archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(0x10000, offset);
	assertEqualInt(0x1000, length);
	assertEqualInt(0, archive_entry_sparse_next(ae, &offset, &length));
	assertEqualInt(0x80000, offset);
	assertEqualInt(0x1000, length);
	/* Verify file contents. */
	memset(buff3, 0, sizeof(buff3));
	for (i = 0; i < 0x10000; i += 1024) {
		assertEqualInt(1024, archive_read_data(a, buff2, 1024));
		failure("Read data(0x%lx - 0x%lx) should be all zero",
		    i, i + 1024);
		assertEqualMem(buff2, buff3, 1024);
	}
	memset(buff3, 'a', sizeof(buff3));
	for (i = 0x10000; i < 0x11000; i += 1024) {
		assertEqualInt(1024, archive_read_data(a, buff2, 1024));
		failure("Read data(0x%lx - 0x%lx) should be all 'a'",
		    i, i + 1024);
		assertEqualMem(buff2, buff3, 1024);
	}
	memset(buff3, 0, sizeof(buff3));
	for (i = 0x11000; i < 0x80000; i += 1024) {
		assertEqualInt(1024, archive_read_data(a, buff2, 1024));
		failure("Read data(0x%lx - 0x%lx) should be all zero",
		    i, i + 1024);
		assertEqualMem(buff2, buff3, 1024);
	}
	memset(buff3, 0, sizeof(buff3));
	for (i = 0x80000; i < 0x81000; i += 1024) {
		assertEqualInt(1024, archive_read_data(a, buff2, 1024));
		failure("Read data(0x%lx - 0x%lx) should be all 'a'",
		    i, i + 1024);
		assertEqualMem(buff2, buff3, 1024);
	}

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(buff2);
}